

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O3

int __thiscall
CAPSFile::DecompressData
          (CAPSFile *this,IDisk *disk,uint ctype,uint cyl,uint head,DataChunks imageItem)

{
  uint uVar1;
  uint uVar2;
  uint in_R9D;
  uint density_buf_size;
  
  uVar2 = *(uint *)imageItem.buffer;
  uVar1 = *(uint *)(imageItem.buffer + 4);
  density_buf_size = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
  ;
  uVar2 = cyl;
  ExtractDensity(this,imageItem.buffer + 8,density_buf_size,cyl,cyl,in_R9D);
  ExtractTrack(this,disk,imageItem.buffer + (long)(int)density_buf_size + 8,
               uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18,uVar2
               ,cyl,head);
  return 0;
}

Assistant:

int CAPSFile::DecompressData(IDisk* disk, DWORD ctype, DWORD cyl, DWORD head, DataChunks imageItem)
{
   // Get the DATA buffer :

   // First PACK size
   int offset = 0;
   int density_buf_size = ExtractInt(&imageItem.buffer[offset]);
   offset += 4;
   // Second PACK size
   int track_buf_size = ExtractInt(&imageItem.buffer[offset]);
   offset += 4;

   // First pack is density information
   ExtractDensity(&imageItem.buffer[offset], density_buf_size, ctype, cyl, head);
   offset += density_buf_size;

   // Second one is track informations
   ExtractTrack(disk, &imageItem.buffer[offset], track_buf_size, ctype, cyl, head);

   return 0;
}